

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::CopyJsonNameTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  ushort uVar1;
  char *pcVar2;
  Arena *arena;
  string_view value;
  
  pcVar2 = (this->all_names_).payload_;
  uVar1 = *(ushort *)(pcVar2 + 0xc);
  value._M_len = (ulong)*(ushort *)(pcVar2 + 0xe);
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 0x10;
  arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = pcVar2 + -(ulong)uVar1;
  protobuf::internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.json_name_,value,arena);
  return;
}

Assistant:

void FieldDescriptor::CopyJsonNameTo(FieldDescriptorProto* proto) const {
  proto->set_json_name(json_name());
}